

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

string * __thiscall Assimp::FIUUIDValueImpl::toString_abi_cxx11_(FIUUIDValueImpl *this)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  char cVar4;
  uint uVar5;
  size_type i;
  long lVar6;
  string asStack_1c8 [32];
  ostringstream os;
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_os + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    std::operator<<((ostringstream *)&os,0x30);
    puVar2 = (this->super_FIUUIDValue).super_FIByteValue.value.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->super_FIUUIDValue).super_FIByteValue.value.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar6 = 0; (long)puVar2 - (long)puVar3 != lVar6; lVar6 = lVar6 + 1) {
      uVar5 = (uint)lVar6 & 0xf;
      cVar4 = '-';
      if (((0xfaaeUL >> uVar5 & 1) == 0) &&
         (((0x550UL >> uVar5 & 1) != 0 || (cVar4 = ' ', lVar6 != 0)))) {
        std::operator<<((ostream *)&os,cVar4);
      }
      *(undefined8 *)((long)&uStack_198 + *(long *)(_os + -0x18)) = 2;
      std::ostream::operator<<
                ((ostream *)&os,
                 (uint)(this->super_FIUUIDValue).super_FIByteValue.value.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar6]);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,asStack_1c8);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::hex << std::uppercase << std::setfill('0');
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                switch (i & 15) {
                case 0:
                    if (i > 0) {
                        os << ' ';
                    }
                    os << std::setw(2) << static_cast<int>(value[i]);
                    break;
                case 4:
                case 6:
                case 8:
                case 10:
                    os << '-';
                    // intentionally fall through!
                case 1:
                case 2:
                case 3:
                case 5:
                case 7:
                case 9:
                case 11:
                case 12:
                case 13:
                case 14:
                case 15:
                    os << std::setw(2) << static_cast<int>(value[i]);
                    break;
                }
            }
            strValue = os.str();
        }
        return strValue;
    }